

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::_::NetworkFilter::NetworkFilter(NetworkFilter *this)

{
  uint in_R8D;
  undefined1 local_34 [28];
  
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00598010;
  (this->allowCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->allowCidrs).builder.ptr = (CidrRange *)0x0;
  (this->allowCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->allowCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  (this->denyCidrs).builder.ptr = (CidrRange *)0x0;
  (this->denyCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->denyCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->denyCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this->allowUnix = true;
  this->allowAbstractUnix = true;
  this->allowPublic = false;
  this->allowNetwork = false;
  (this->next).ptr = (NetworkFilter *)0x0;
  local_34._0_4_ = 0;
  CidrRange::inet4((CidrRange *)(local_34 + 4),(CidrRange *)local_34,
                   (ArrayPtr<const_unsigned_char>)ZEXT816(4),in_R8D);
  Vector<kj::CidrRange>::add<kj::CidrRange>(&this->allowCidrs,(CidrRange *)(local_34 + 4));
  CidrRange::inet6((CidrRange *)(local_34 + 4),(ArrayPtr<const_unsigned_short>)ZEXT816(0),
                   (ArrayPtr<const_unsigned_short>)ZEXT816(0),0);
  Vector<kj::CidrRange>::add<kj::CidrRange>(&this->allowCidrs,(CidrRange *)(local_34 + 4));
  return;
}

Assistant:

NetworkFilter::NetworkFilter()
    : allowUnix(true), allowAbstractUnix(true) {
  allowCidrs.add(CidrRange::inet4({0,0,0,0}, 0));
  allowCidrs.add(CidrRange::inet6({}, {}, 0));
}